

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O1

int main(void)

{
  Format mainFormat;
  string str;
  CppLogger errorLogger;
  CppLogger mainLogger;
  void *local_4f8 [2];
  long local_4e8;
  long *local_4e0;
  long local_4d8;
  long local_4d0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  string local_4a0;
  string local_480;
  long *local_460 [2];
  long local_450 [2];
  long *local_440 [2];
  long local_430 [2];
  long *local_420 [2];
  long local_410 [2];
  long *local_400 [2];
  long local_3f0 [2];
  long *local_3e0 [2];
  long local_3d0 [2];
  long *local_3c0 [2];
  long local_3b0 [2];
  long *local_3a0 [2];
  long local_390 [2];
  long *local_380 [2];
  long local_370 [2];
  long *local_360 [2];
  long local_350 [2];
  long *local_340 [2];
  long local_330 [2];
  long *local_320 [2];
  long local_310 [2];
  undefined4 local_300;
  undefined4 uStack_2fc;
  undefined4 uStack_2f8;
  undefined4 uStack_2f4;
  CppLogger local_190 [368];
  
  CppLogger::CppLogger::CppLogger(local_190,Trace,"Main",false);
  local_320[0] = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"Test","");
  CppLogger::CppLogger::printTrace(local_190,local_320);
  if (local_320[0] != local_310) {
    operator_delete(local_320[0],local_310[0] + 1);
  }
  local_300 = 2;
  uStack_2fc = 1;
  uStack_2f8 = 3;
  uStack_2f4 = 4;
  CppLogger::Format::Format((Format *)local_4f8,&local_300,4);
  CppLogger::CppLogger::setFormat((Format *)local_190);
  local_340[0] = local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"Main","");
  CppLogger::CppLogger::printTrace(local_190,local_340);
  if (local_340[0] != local_330) {
    operator_delete(local_340[0],local_330[0] + 1);
  }
  local_360[0] = local_350;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"Main","");
  CppLogger::CppLogger::printInfo(local_190,local_360);
  if (local_360[0] != local_350) {
    operator_delete(local_360[0],local_350[0] + 1);
  }
  local_380[0] = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"Main","");
  CppLogger::CppLogger::printWarn(local_190,local_380);
  if (local_380[0] != local_370) {
    operator_delete(local_380[0],local_370[0] + 1);
  }
  local_3a0[0] = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"Main","");
  CppLogger::CppLogger::printError(local_190,local_3a0);
  if (local_3a0[0] != local_390) {
    operator_delete(local_3a0[0],local_390[0] + 1);
  }
  local_3c0[0] = local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"Main","");
  CppLogger::CppLogger::printFatalError(local_190,local_3c0);
  if (local_3c0[0] != local_3b0) {
    operator_delete(local_3c0[0],local_3b0[0] + 1);
  }
  CppLogger::CppLogger::CppLogger((CppLogger *)&local_300,Trace,"Error logger",false);
  CppLogger::CppLogger::setFormat((Format *)&local_300);
  CppLogger::CppLogger::setOStream((ostream *)&local_300);
  local_3e0[0] = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"Error","");
  CppLogger::CppLogger::printTrace(&local_300,local_3e0);
  if (local_3e0[0] != local_3d0) {
    operator_delete(local_3e0[0],local_3d0[0] + 1);
  }
  local_400[0] = local_3f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"Error","");
  CppLogger::CppLogger::printInfo(&local_300,local_400);
  if (local_400[0] != local_3f0) {
    operator_delete(local_400[0],local_3f0[0] + 1);
  }
  local_420[0] = local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"Error","");
  CppLogger::CppLogger::printWarn(&local_300,local_420);
  if (local_420[0] != local_410) {
    operator_delete(local_420[0],local_410[0] + 1);
  }
  local_440[0] = local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"Error","");
  CppLogger::CppLogger::printError(&local_300,local_440);
  if (local_440[0] != local_430) {
    operator_delete(local_440[0],local_430[0] + 1);
  }
  local_460[0] = local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"Error","");
  CppLogger::CppLogger::printFatalError(&local_300,local_460);
  if (local_460[0] != local_450) {
    operator_delete(local_460[0],local_450[0] + 1);
  }
  local_4e0 = local_4d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"I shall be logged","");
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_480,"Printing a:{}, and b: {}, but not f;","");
  CppLogger::CppLogger::printTrace<int,char,float>((CppLogger *)&local_300,&local_480,5,'b',5.4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"{}","");
  local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4c0,local_4e0,local_4d8 + (long)local_4e0);
  CppLogger::CppLogger::printWarn<std::__cxx11::string>
            ((CppLogger *)&local_300,&local_4a0,&local_4c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  if (local_4e0 != local_4d0) {
    operator_delete(local_4e0,local_4d0[0] + 1);
  }
  CppLogger::CppLogger::~CppLogger((CppLogger *)&local_300);
  if (local_4f8[0] != (void *)0x0) {
    operator_delete(local_4f8[0],local_4e8 - (long)local_4f8[0]);
  }
  CppLogger::CppLogger::~CppLogger(local_190);
  return 0;
}

Assistant:

int main() {
    // Creating a logger (the last parameter is false by default and 
    //  if is set to true it will exit after a printFatalError())
    CppLogger::CppLogger mainLogger(CppLogger::Level::Trace, "Main"/*, true*/);

    // Trace level log
    mainLogger.printTrace("Test");

    // Create a format for your logger (the order of the format is respected)
    CppLogger::Format mainFormat({
            CppLogger::FormatAttribute::Time,
            CppLogger::FormatAttribute::Name,
            CppLogger::FormatAttribute::Level,
            CppLogger::FormatAttribute::Message
            });

    // Apply the format to your logger
    mainLogger.setFormat(mainFormat);

    // Different levels of logging
    mainLogger.printTrace("Main");
    mainLogger.printInfo("Main");
    mainLogger.printWarn("Main");
    mainLogger.printError("Main");
    mainLogger.printFatalError("Main");

    CppLogger::CppLogger errorLogger(CppLogger::Level::Trace, "Error logger");

    errorLogger.setFormat(mainFormat);

    errorLogger.setOStream(std::cerr);

    errorLogger.printTrace("Error");
    errorLogger.printInfo("Error");
    errorLogger.printWarn("Error");
    errorLogger.printError("Error");
    errorLogger.printFatalError("Error");

    int a = 5;
    char b = 'b';
    std::string str = "I shall be logged";
    float f = 5.4f;

    errorLogger.printTrace("Printing a:{}, and b: {}, but not f;", a, b, f);
    errorLogger.printWarn("{}", str);
}